

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserTest_WarnIfSyntaxIdentifierOmitted_Test::
ParserTest_WarnIfSyntaxIdentifierOmitted_Test(ParserTest_WarnIfSyntaxIdentifierOmitted_Test *this)

{
  ParserTest_WarnIfSyntaxIdentifierOmitted_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParserTest);
  (this->super_ParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParserTest_WarnIfSyntaxIdentifierOmitted_Test_02a09ef8;
  return;
}

Assistant:

TEST_F(ParserTest, WarnIfSyntaxIdentifierOmitted) {
  SetupParser("message A {}");
  FileDescriptorProto file;
  CaptureTestStderr();
  EXPECT_TRUE(parser_->Parse(input_.get(), &file));
  EXPECT_TRUE(GetCapturedTestStderr().find("No edition or syntax specified") !=
              std::string::npos);
}